

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

QPropertyBindingData * __thiscall
QBindingStoragePrivate::get(QBindingStoragePrivate *this,QUntypedPropertyData *data,bool create)

{
  QBindingStorageData *pQVar1;
  QBindingStorageData *pQVar2;
  ulong uVar3;
  size_t newSize;
  
  pQVar2 = *this->d;
  if (pQVar2 == (QBindingStorageData *)0x0) {
    if (!create) {
      return (QPropertyBindingData *)0x0;
    }
    newSize = 8;
  }
  else {
    if (pQVar2->used * 2 < pQVar2->size) goto LAB_00298c11;
    newSize = pQVar2->size * 2;
  }
  reallocate(this,newSize);
LAB_00298c11:
  uVar3 = ((ulong)data >> 0x20 ^ (ulong)data) * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  pQVar2 = *this->d;
  uVar3 = pQVar2->size - 1 & (uVar3 >> 0x20 ^ uVar3);
  while( true ) {
    pQVar1 = pQVar2 + uVar3 + 1;
    if ((QUntypedPropertyData *)pQVar2[uVar3 + 1].size == (QUntypedPropertyData *)0x0) break;
    if ((QUntypedPropertyData *)pQVar2[uVar3 + 1].size == data) goto LAB_00298c8e;
    uVar3 = uVar3 + 1;
    if (uVar3 == pQVar2->size) {
      uVar3 = 0;
    }
  }
  if (!create) {
    return (QPropertyBindingData *)0x0;
  }
  pQVar2->used = pQVar2->used + 1;
  pQVar1->size = (size_t)data;
  pQVar1->used = 0;
LAB_00298c8e:
  return (QPropertyBindingData *)&pQVar1->used;
}

Assistant:

QPropertyBindingData *get(QUntypedPropertyData *data, bool create)
    {
        if (!d) {
            if (!create)
                return nullptr;
            reallocate(8);
        }
        else if (d->used*2 >= d->size)
            reallocate(d->size*2);
        Q_ASSERT(d->size && (d->size & (d->size - 1)) == 0); // size is a power of two
        size_t index = qHash(data) & (d->size - 1);
        Pair *p = pairs(d);
        while (p[index].data) {
            if (p[index].data == data)
                return &p[index].bindingData;
            ++index;
            if (index == d->size)
                index = 0;
        }
        if (!create)
            return nullptr;
        ++d->used;
        new (p + index) Pair{data, QPropertyBindingData()};
        return &p[index].bindingData;
    }